

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration_manager.cpp
# Opt level: O0

ReturnStruct * __thiscall
miniros::master::RegistrationManager::unregisterObject
          (RegistrationManager *this,Registrations *r,string *key,string *caller_id,
          string *caller_api,string *service_api)

{
  bool bVar1;
  Type TVar2;
  XmlRpcValue *_value;
  ReturnStruct *this_00;
  ReturnStruct *pRVar3;
  Registrations *in_RDX;
  ReturnStruct *in_RSI;
  ReturnStruct *in_RDI;
  string *in_R8;
  stringstream ss;
  string *in_stack_00000118;
  string *in_stack_00000120;
  string *in_stack_00000128;
  string *in_stack_00000130;
  Registrations *in_stack_00000138;
  shared_ptr<miniros::master::NodeRef> node_ref;
  scoped_lock<std::mutex> lock;
  ReturnStruct *ret;
  ReturnStruct *in_stack_fffffffffffffce8;
  ReturnStruct *in_stack_fffffffffffffcf0;
  undefined7 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcff;
  element_type *in_stack_fffffffffffffd00;
  XmlRpcValue *in_stack_fffffffffffffd18;
  ReturnStruct *__k;
  XmlRpcValue local_2c0;
  string local_2b0 [88];
  stringstream local_258 [16];
  ostream local_248 [448];
  XmlRpcValue local_88 [2];
  allocator<char> local_61;
  string local_60 [39];
  undefined1 local_39;
  string *local_28;
  Registrations *local_18;
  
  __k = in_RDI;
  local_28 = in_R8;
  local_18 = in_RDX;
  ::std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_fffffffffffffcf0,
             (mutex_type *)in_stack_fffffffffffffce8);
  local_39 = 0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,(char *)__k
             ,(allocator<char> *)in_RDI);
  XmlRpc::XmlRpcValue::XmlRpcValue(local_88);
  ReturnStruct::ReturnStruct
            (in_RSI,(int)((ulong)__k >> 0x20),(string *)in_RDI,in_stack_fffffffffffffd18);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x544b4f);
  ::std::__cxx11::string::~string(local_60);
  ::std::allocator<char>::~allocator(&local_61);
  _value = (XmlRpcValue *)
           ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
           ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
                    *)in_stack_fffffffffffffd00,
                   (key_type *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
  if (_value == (XmlRpcValue *)0x0) {
    ::std::__cxx11::stringstream::stringstream(local_258);
    this_00 = (ReturnStruct *)::std::operator<<(local_248,"[");
    pRVar3 = (ReturnStruct *)::std::operator<<((ostream *)this_00,local_28);
    ::std::operator<<((ostream *)pRVar3,"] is not a registered node");
    ::std::__cxx11::stringstream::str();
    XmlRpc::XmlRpcValue::XmlRpcValue(&local_2c0,1);
    ReturnStruct::ReturnStruct(in_RSI,(int)((ulong)__k >> 0x20),(string *)in_RDI,_value);
    ReturnStruct::operator=(this_00,pRVar3);
    ReturnStruct::~ReturnStruct(this_00);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x544e55);
    ::std::__cxx11::string::~string(local_2b0);
    ::std::__cxx11::stringstream::~stringstream(local_258);
  }
  else {
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
                  *)in_RSI,(key_type *)__k);
    ::std::shared_ptr<miniros::master::NodeRef>::shared_ptr
              ((shared_ptr<miniros::master::NodeRef> *)in_stack_fffffffffffffcf0,
               (shared_ptr<miniros::master::NodeRef> *)in_stack_fffffffffffffce8);
    Registrations::unregisterObj
              (in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000120,
               in_stack_00000118);
    ReturnStruct::operator=(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    ReturnStruct::~ReturnStruct(in_stack_fffffffffffffcf0);
    if (in_RDI->statusCode == 1) {
      in_stack_fffffffffffffd00 =
           ::std::
           __shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x544c3d);
      TVar2 = Registrations::type(local_18);
      NodeRef::remove(in_stack_fffffffffffffd00,(char *)(ulong)TVar2);
    }
    ::std::__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x544d3d);
    bVar1 = NodeRef::is_empty(in_stack_fffffffffffffd00);
    if (bVar1) {
      ::std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
      ::erase((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::NodeRef>_>_>_>
               *)in_stack_fffffffffffffcf0,(key_type *)in_stack_fffffffffffffce8);
    }
    ::std::shared_ptr<miniros::master::NodeRef>::~shared_ptr
              ((shared_ptr<miniros::master::NodeRef> *)0x544d7f);
  }
  local_39 = 1;
  ::std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x544f20);
  return __k;
}

Assistant:

ReturnStruct RegistrationManager::unregisterObject(Registrations& r, const std::string& key,
  const std::string& caller_id, const std::string& caller_api, const std::string& service_api)
{
  std::scoped_lock<std::mutex> lock(m_guard);

  ReturnStruct ret;
  if (m_nodes.count(caller_id)) {
    std::shared_ptr<NodeRef> node_ref = m_nodes[caller_id];
    ret = r.unregisterObj(key, caller_id, caller_api, service_api);
    if (ret.statusCode == 1) {
      node_ref->remove(r.type(), key);
    }
    if (node_ref->is_empty()) {
      m_nodes.erase(caller_id);
    }
  } else {
    std::stringstream ss;
    ss << "[" << caller_id << "] is not a registered node";
    ret = ReturnStruct(0, ss.str(), RpcValue(1));
  }
  return ret;
}